

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O2

int repeat_segment_mix(mixed_segment *segment)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  long lVar5;
  uint uVar6;
  uint32_t i;
  ulong uVar7;
  int iVar8;
  float fVar9;
  uint32_t samples;
  float *in;
  float *out;
  
  puVar4 = (undefined8 *)segment->data;
  uVar1 = *(uint *)(puVar4 + 3);
  uVar6 = *(uint *)((long)puVar4 + 0x1c);
  lVar5 = puVar4[2];
  samples = 0xffffffff;
  if (*(int *)(puVar4 + 5) == 3) {
    samples = uVar1 - uVar6;
  }
  mixed_buffer_request_read(&in,&samples,(mixed_buffer *)*puVar4);
  mixed_buffer_request_write(&out,&samples,(mixed_buffer *)puVar4[1]);
  uVar7 = 0;
  do {
    if (samples == uVar7) {
      mixed_buffer_finish_read(samples,(mixed_buffer *)*puVar4);
      mixed_buffer_finish_write(samples,(mixed_buffer *)puVar4[1]);
      if (((*(int *)(puVar4 + 5) == 3) && (uVar6 == 0)) && (samples != 0)) {
        *(undefined4 *)(puVar4 + 5) = 2;
      }
      *(uint *)((long)puVar4 + 0x1c) = uVar6;
      return 1;
    }
    uVar2 = *(uint *)((long)puVar4 + 0x2c);
    uVar3 = *(uint *)(puVar4 + 6);
    fVar9 = (float)uVar2 / (float)uVar3;
    fVar9 = (1.0 - fVar9) * *(float *)(lVar5 + (ulong)uVar6 * 4) + fVar9 * in[uVar7];
    *(float *)(lVar5 + (ulong)uVar6 * 4) = fVar9;
    if (*(int *)(puVar4 + 5) == 2) {
      iVar8 = -1;
      if (uVar2 != 0) {
LAB_0013e8bb:
        *(uint *)((long)puVar4 + 0x2c) = iVar8 + uVar2;
      }
    }
    else {
      iVar8 = 1;
      if (uVar2 < uVar3) goto LAB_0013e8bb;
    }
    out[uVar7] = fVar9;
    uVar6 = (uVar6 + 1) % uVar1;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int repeat_segment_mix(struct mixed_segment *segment){
  struct repeat_segment_data *data = (struct repeat_segment_data *)segment->data;

  uint32_t repeat_samples = data->buffer_size;
  uint32_t index = data->buffer_index;
  float *restrict buf = data->buffer;

  float *restrict in, *restrict out;
  uint32_t samples = UINT32_MAX;
  if (data->mode == MIXED_RECORD_ONCE) {
    samples = repeat_samples - index;
  }

  mixed_buffer_request_read(&in, &samples, data->in);
  mixed_buffer_request_write(&out, &samples, data->out);
  for(uint32_t i=0; i<samples; ++i){
    buf[index] = LERP(buf[index], in[i], data->fade_position/(float)data->fade_length);
    if (data->mode == MIXED_PLAY) {
      if (data->fade_position > 0) {
        data->fade_position--;
      }
    } else {
      if (data->fade_position < data->fade_length) {
        data->fade_position++;
      }
    }
    out[i] = buf[index];
    index = (index+1)%repeat_samples;
  }
  mixed_buffer_finish_read(samples, data->in);
  mixed_buffer_finish_write(samples, data->out);

  if (data->mode == MIXED_RECORD_ONCE && index == 0 && samples > 0) {
    data->mode = MIXED_PLAY;
  }

  data->buffer_index = index;
  return 1;
}